

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
CreateContextCore(JsRuntimeHandle runtimeHandle,TTDRecorder *_actionEntryPopper,bool inRecordMode,
                 bool activelyRecording,bool inReplayMode,JsContextRef *newContext)

{
  EventLog *this;
  bool bVar1;
  bool debugMode;
  JsrtRuntime *this_00;
  Recycler *pRVar2;
  JsrtContext *this_01;
  JsrtDebugManager *this_02;
  DebugManager *this_03;
  ScriptContext *pSVar3;
  DebugContext *this_04;
  ProbeContainer *this_05;
  DebuggerOptionsCallback *local_150;
  HostDebugContext *local_128;
  ProbeContainer *probeContainer;
  DebugContext *debugContext;
  ScriptContext *scriptContext_1;
  JsrtDebugManager *jsrtDebugManager;
  undefined1 local_a8 [6];
  bool doDebug;
  bool noNative;
  HostScriptContextCallbackFunctor callbackFunctor;
  ScriptContext *scriptContext;
  JsrtContext *context;
  EventLogEntry *createEvent;
  undefined1 local_50 [8];
  ThreadContextScope scope;
  ThreadContext *threadContext;
  JsrtRuntime *runtime;
  JsContextRef *newContext_local;
  bool inReplayMode_local;
  bool activelyRecording_local;
  bool inRecordMode_local;
  TTDRecorder *_actionEntryPopper_local;
  JsRuntimeHandle runtimeHandle_local;
  
  this_00 = JsrtRuntime::FromHandle(runtimeHandle);
  scope.originalContext = JsrtRuntime::GetThreadContext(this_00);
  pRVar2 = ThreadContext::GetRecycler(scope.originalContext);
  if (pRVar2 != (Recycler *)0x0) {
    pRVar2 = ThreadContext::GetRecycler(scope.originalContext);
    bVar1 = Memory::Recycler::IsHeapEnumInProgress(pRVar2);
    if (bVar1) {
      return JsErrorHeapEnumInProgress;
    }
  }
  bVar1 = ThreadContext::IsInThreadServiceCallback(scope.originalContext);
  if (bVar1) {
    runtimeHandle_local._4_4_ = JsErrorInThreadServiceCallback;
  }
  else {
    ThreadContextScope::ThreadContextScope((ThreadContextScope *)local_50,scope.originalContext);
    bVar1 = ThreadContextScope::IsValid((ThreadContextScope *)local_50);
    if (bVar1) {
      context = (JsrtContext *)0x0;
      if (activelyRecording) {
        context = (JsrtContext *)
                  TTD::EventLog::RecordJsRTCreateScriptContext
                            ((scope.originalContext)->TTDLog,_actionEntryPopper);
      }
      this_01 = JsrtContext::New(this_00);
      if (inRecordMode || inReplayMode) {
        callbackFunctor.pfOnBPClearDocumentCallback =
             (JsTTDOnBPClearDocumentCallback)JsrtContext::GetScriptContext(this_01);
        HostScriptContextCallbackFunctor::HostScriptContextCallbackFunctor
                  ((HostScriptContextCallbackFunctor *)local_a8,&this_01->super_FinalizableObject,
                   this_00,OnScriptLoad_TTDCallback,OnBPRegister_TTDCallback,OnBPDelete_TTDCallback,
                   OnBPClearDocument_TTDCallback);
        bVar1 = TTD::EventLog::IsDebugModeFlagSet((scope.originalContext)->TTDLog);
        debugMode = TTD::EventLog::IsDebugModeFlagSet((scope.originalContext)->TTDLog);
        TTD::EventLog::PushMode((scope.originalContext)->TTDLog,ExcludedExecutionTTAction);
        if (inRecordMode) {
          TTD::ThreadContextTTD::AddNewScriptContextRecord
                    ((scope.originalContext)->TTDContext,&this_01->super_FinalizableObject,
                     (ScriptContext *)callbackFunctor.pfOnBPClearDocumentCallback,
                     (HostScriptContextCallbackFunctor *)local_a8,bVar1,debugMode);
        }
        else {
          TTD::ThreadContextTTD::AddNewScriptContextReplay
                    ((scope.originalContext)->TTDContext,&this_01->super_FinalizableObject,
                     (ScriptContext *)callbackFunctor.pfOnBPClearDocumentCallback,
                     (HostScriptContextCallbackFunctor *)local_a8,bVar1,debugMode);
        }
        TTD::EventLog::SetModeFlagsOnContext
                  ((scope.originalContext)->TTDLog,
                   (ScriptContext *)callbackFunctor.pfOnBPClearDocumentCallback);
        TTD::EventLog::PopMode((scope.originalContext)->TTDLog,ExcludedExecutionTTAction);
      }
      this_02 = JsrtRuntime::GetJsrtDebugManager(this_00);
      if (this_02 != (JsrtDebugManager *)0x0) {
        this_03 = ThreadContext::GetDebugManager(scope.originalContext);
        Js::DebugManager::SetLocalsDisplayFlags(this_03,LocalsDisplayFlags_NoGroupMethods);
        pSVar3 = JsrtContext::GetScriptContext(this_01);
        this_04 = Js::ScriptContext::GetDebugContext(pSVar3);
        local_128 = (HostDebugContext *)0x0;
        if (this_02 != (JsrtDebugManager *)0x0) {
          local_128 = &this_02->super_HostDebugContext;
        }
        Js::DebugContext::SetHostDebugContext(this_04,local_128);
        bVar1 = JsrtDebugManager::IsDebugEventCallbackSet(this_02);
        if (bVar1) {
          Js::ScriptContext::InitializeDebugging(pSVar3);
          this_05 = Js::DebugContext::GetProbeContainer(this_04);
          Js::ProbeContainer::InitializeInlineBreakEngine(this_05,&this_02->super_HaltCallback);
          local_150 = (DebuggerOptionsCallback *)0x0;
          if (this_02 != (JsrtDebugManager *)0x0) {
            local_150 = &this_02->super_DebuggerOptionsCallback;
          }
          Js::ProbeContainer::InitializeDebuggerScriptOptionCallback(this_05,local_150);
        }
        else {
          Js::DebugContext::SetDebuggerMode(this_04,SourceRundown);
        }
      }
      if (activelyRecording) {
        this = (scope.originalContext)->TTDLog;
        pSVar3 = JsrtContext::GetScriptContext(this_01);
        TTD::EventLog::RecordJsRTCreateScriptContextResult(this,(EventLogEntry *)context,pSVar3);
      }
      *newContext = this_01;
      runtimeHandle_local._4_4_ = JsNoError;
    }
    else {
      runtimeHandle_local._4_4_ = JsErrorWrongThread;
    }
    ThreadContextScope::~ThreadContextScope((ThreadContextScope *)local_50);
  }
  return runtimeHandle_local._4_4_;
}

Assistant:

JsErrorCode CreateContextCore(_In_ JsRuntimeHandle runtimeHandle, _In_ TTDRecorder& _actionEntryPopper, _In_ bool inRecordMode, _In_ bool activelyRecording, _In_ bool inReplayMode, _Out_ JsContextRef *newContext)
{
    JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext * threadContext = runtime->GetThreadContext();

    if(threadContext->GetRecycler() && threadContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if(threadContext->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    ThreadContextScope scope(threadContext);

    if(!scope.IsValid())
    {
        return JsErrorWrongThread;
    }

#if ENABLE_TTD
    TTD::NSLogEvents::EventLogEntry* createEvent = nullptr;
    if(activelyRecording)
    {
        createEvent = threadContext->TTDLog->RecordJsRTCreateScriptContext(_actionEntryPopper);
    }
#endif

    JsrtContext * context = JsrtContext::New(runtime);

#if ENABLE_TTD
    if(inRecordMode | inReplayMode)
    {
        Js::ScriptContext* scriptContext = context->GetScriptContext();
        HostScriptContextCallbackFunctor callbackFunctor((FinalizableObject*)context, (void*)runtime, &OnScriptLoad_TTDCallback, &OnBPRegister_TTDCallback, &OnBPDelete_TTDCallback, &OnBPClearDocument_TTDCallback);

#if ENABLE_TTD_DIAGNOSTICS_TRACING
        bool noNative = true;
        bool doDebug = true;
#else
        bool noNative = TTD_FORCE_NOJIT_MODE || threadContext->TTDLog->IsDebugModeFlagSet();
        bool doDebug = TTD_FORCE_DEBUG_MODE || threadContext->TTDLog->IsDebugModeFlagSet();
#endif

        threadContext->TTDLog->PushMode(TTD::TTDMode::ExcludedExecutionTTAction);
        if(inRecordMode)
        {
            threadContext->TTDContext->AddNewScriptContextRecord(context, scriptContext, callbackFunctor, noNative, doDebug);
        }
        else
        {
            threadContext->TTDContext->AddNewScriptContextReplay(context, scriptContext, callbackFunctor, noNative, doDebug);
        }

        threadContext->TTDLog->SetModeFlagsOnContext(scriptContext);
        threadContext->TTDLog->PopMode(TTD::TTDMode::ExcludedExecutionTTAction);
    }
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
    JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

    if(jsrtDebugManager != nullptr)
    {
        // JsDiagStartDebugging was called
        threadContext->GetDebugManager()->SetLocalsDisplayFlags(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods);

        Js::ScriptContext* scriptContext = context->GetScriptContext();

        Js::DebugContext* debugContext = scriptContext->GetDebugContext();
        debugContext->SetHostDebugContext(jsrtDebugManager);

        if (!jsrtDebugManager->IsDebugEventCallbackSet())
        {
            // JsDiagStopDebugging was called so we need to be in SourceRunDownMode
            debugContext->SetDebuggerMode(Js::DebuggerMode::SourceRundown);
        }
        else
        {
            // Set Debugging mode
            scriptContext->InitializeDebugging();
            Js::ProbeContainer* probeContainer = debugContext->GetProbeContainer();
            probeContainer->InitializeInlineBreakEngine(jsrtDebugManager);
            probeContainer->InitializeDebuggerScriptOptionCallback(jsrtDebugManager);
        }
    }
#endif

#if ENABLE_TTD
    if(activelyRecording)
    {
        threadContext->TTDLog->RecordJsRTCreateScriptContextResult(createEvent, context->GetScriptContext());
    }
#endif

    *newContext = (JsContextRef)context;
    return JsNoError;
}